

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.h
# Opt level: O3

void __thiscall
minibag::Bag::doWrite<minibag::MessageInstance>
          (Bag *this,string *topic,Time *time,MessageInstance *msg,
          shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *connection_header)

{
  _Rb_tree_color _Var1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__x;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar3;
  uint uVar4;
  mapped_type *pmVar5;
  iterator iVar6;
  mapped_type *ppCVar7;
  iterator iVar8;
  _Rb_tree_color *p_Var9;
  undefined8 uVar10;
  mapped_type __k;
  undefined8 *puVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  mapped_type_conflict *pmVar13;
  runtime_error *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *psVar14;
  uint32_t conn_id;
  M_string connection_header_copy;
  _Alloc_node __an;
  _Rb_tree_color local_9c;
  undefined1 local_98 [48];
  MessageInstance *local_68;
  key_type local_60;
  string *local_40;
  string *local_38;
  
  uVar4 = (time->super_TimeBase<miniros::Time,_miniros::Duration>).sec;
  local_68 = msg;
  if (((uint)miniros::TIME_MIN <= uVar4) &&
     ((uVar4 != (uint)miniros::TIME_MIN ||
      (miniros::TIME_MIN._4_4_ <= (time->super_TimeBase<miniros::Time,_miniros::Duration>).nsec))))
  {
    *(int *)(this + 0x8c) = *(int *)(this + 0x8c) + 1;
    local_9c = _S_red;
    __x = &((connection_header->
            super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr)->_M_t;
    if (__x == (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x0) {
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)(this + 0x108),topic);
      if (iVar8._M_node == (_Base_ptr)(this + 0x110)) {
        _Var1 = *(_Rb_tree_color *)(this + 400);
        local_9c = _Var1;
        p_Var9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               *)(this + 0x108),topic);
        *p_Var9 = _Var1;
        __k = (mapped_type)0x0;
      }
      else {
        local_9c = iVar8._M_node[2]._M_color;
        ppCVar7 = std::
                  map<unsigned_int,_minibag::ConnectionInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_minibag::ConnectionInfo_*>_>_>
                  ::operator[]((map<unsigned_int,_minibag::ConnectionInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_minibag::ConnectionInfo_*>_>_>
                                *)(this + 0x168),&local_9c);
        __k = *ppCVar7;
      }
    }
    else {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_98,__x);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"topic","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_98,&local_60);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      iVar6 = std::_Rb_tree<$6cc845ac$>::find
                        ((_Rb_tree<_6cc845ac_> *)(this + 0x138),(key_type *)local_98);
      if (iVar6._M_node == (_Base_ptr)(this + 0x140)) {
        _Var1 = *(_Rb_tree_color *)(this + 400);
        local_9c = _Var1;
        p_Var9 = std::
                 map<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_unsigned_int,_std::less<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_unsigned_int>_>_>
                 ::operator[]((map<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_unsigned_int,_std::less<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_unsigned_int>_>_>
                               *)(this + 0x138),(key_type *)local_98);
        *p_Var9 = _Var1;
        __k = (mapped_type)0x0;
      }
      else {
        local_9c = *(_Rb_tree_color *)&iVar6._M_node[2]._M_left;
        ppCVar7 = std::
                  map<unsigned_int,_minibag::ConnectionInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_minibag::ConnectionInfo_*>_>_>
                  ::operator[]((map<unsigned_int,_minibag::ConnectionInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_minibag::ConnectionInfo_*>_>_>
                                *)(this + 0x168),&local_9c);
        __k = *ppCVar7;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_98);
    }
    minibag::Bag::seek((ulong)this,0);
    uVar10 = minibag::ChunkedFile::getOffset();
    *(undefined8 *)(this + 0x90) = uVar10;
    if (this[0xb0] == (Bag)0x0) {
      minibag::Bag::startWritingChunk((Time)this);
    }
    if (__k == (mapped_type)0x0) {
      __k = (mapped_type)operator_new(0x98);
      (__k->topic)._M_dataplus._M_p = (pointer)&(__k->topic).field_2;
      (__k->topic)._M_string_length = 0;
      (__k->topic).field_2._M_local_buf[0] = '\0';
      (__k->datatype)._M_dataplus._M_p = (pointer)&(__k->datatype).field_2;
      (__k->datatype)._M_string_length = 0;
      (__k->datatype).field_2._M_local_buf[0] = '\0';
      (__k->md5sum)._M_dataplus._M_p = (pointer)&(__k->md5sum).field_2;
      (__k->md5sum)._M_string_length = 0;
      (__k->md5sum).field_2._M_local_buf[0] = '\0';
      (__k->msg_def)._M_dataplus._M_p = (pointer)&(__k->msg_def).field_2;
      (__k->msg_def)._M_string_length = 0;
      (__k->msg_def).field_2._M_local_buf[0] = '\0';
      (__k->header).
      super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      (__k->header).
      super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      __k->id = local_9c;
      std::__cxx11::string::_M_assign((string *)&__k->topic);
      puVar11 = (undefined8 *)minibag::MessageInstance::getDataType_abi_cxx11_();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,(char *)*puVar11,(allocator<char> *)&local_60);
      std::__cxx11::string::operator=((string *)&__k->datatype,(string *)local_98);
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,CONCAT44(local_98._20_4_,local_98._16_4_) + 1);
      }
      puVar11 = (undefined8 *)minibag::MessageInstance::getMD5Sum_abi_cxx11_();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,(char *)*puVar11,(allocator<char> *)&local_60);
      local_38 = &__k->md5sum;
      std::__cxx11::string::operator=((string *)local_38,(string *)local_98);
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,CONCAT44(local_98._20_4_,local_98._16_4_) + 1);
      }
      puVar11 = (undefined8 *)minibag::MessageInstance::getMessageDefinition_abi_cxx11_();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,(char *)*puVar11,(allocator<char> *)&local_60);
      local_40 = &__k->msg_def;
      std::__cxx11::string::operator=((string *)local_40,(string *)local_98);
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,CONCAT44(local_98._20_4_,local_98._16_4_) + 1);
      }
      peVar2 = (connection_header->
               super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        psVar14 = &__k->header;
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
        p_Var12->_M_use_count = 1;
        p_Var12->_M_weak_count = 1;
        p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00170ea0;
        this_02 = p_Var12 + 1;
        p_Var12[1]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var12[1]._M_use_count = 0;
        p_Var12[1]._M_weak_count = 0;
        p_Var12[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        *(_Atomic_word **)&p_Var12[2]._M_use_count = &p_Var12[1]._M_use_count;
        p_Var12[3]._vptr__Sp_counted_base = (_func_int **)&p_Var12[1]._M_use_count;
        p_Var12[3]._M_use_count = 0;
        p_Var12[3]._M_weak_count = 0;
        (__k->header).
        super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)this_02;
        this_00 = (__k->header).
                  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        (__k->header).
        super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Var12;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (psVar14->
                    super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
        }
        local_98._0_8_ = local_98 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"type","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)this_02,(key_type *)local_98);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_,CONCAT44(local_98._20_4_,local_98._16_4_) + 1);
        }
        pmVar3 = (psVar14->
                 super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        local_98._0_8_ = local_98 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"md5sum","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar3,(key_type *)local_98);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_,CONCAT44(local_98._20_4_,local_98._16_4_) + 1);
        }
        pmVar3 = (psVar14->
                 super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        local_98._0_8_ = local_98 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"message_definition","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar3,(key_type *)local_98);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_,CONCAT44(local_98._20_4_,local_98._16_4_) + 1);
        }
      }
      else {
        (__k->header).
        super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = peVar2;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__k->header).
                    super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   &(connection_header->
                    super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount);
      }
      ppCVar7 = std::
                map<unsigned_int,_minibag::ConnectionInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_minibag::ConnectionInfo_*>_>_>
                ::operator[]((map<unsigned_int,_minibag::ConnectionInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_minibag::ConnectionInfo_*>_>_>
                              *)(this + 0x168),&local_9c);
      *ppCVar7 = __k;
      minibag::Bag::writeConnectionRecord((ConnectionInfo *)this,SUB81(__k,0));
      minibag::Bag::appendConnectionRecordToBuffer((Buffer *)this,(ConnectionInfo *)(this + 0x250));
    }
    local_98._0_8_ = time->super_TimeBase<miniros::Time,_miniros::Duration>;
    local_98._8_8_ = *(undefined8 *)(this + 200);
    local_98._16_4_ = minibag::Bag::getChunkOffset();
    local_60._M_dataplus._M_p =
         (pointer)std::
                  map<unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>_>
                  ::operator[]((map<unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>_>
                                *)(this + 0x1e0),&__k->id);
    std::
    _Rb_tree<minibag::IndexEntry,minibag::IndexEntry,std::_Identity<minibag::IndexEntry>,std::less<minibag::IndexEntry>,std::allocator<minibag::IndexEntry>>
    ::
    _M_insert_equal_<minibag::IndexEntry_const&,std::_Rb_tree<minibag::IndexEntry,minibag::IndexEntry,std::_Identity<minibag::IndexEntry>,std::less<minibag::IndexEntry>,std::allocator<minibag::IndexEntry>>::_Alloc_node>
              ((_Rb_tree<minibag::IndexEntry,minibag::IndexEntry,std::_Identity<minibag::IndexEntry>,std::less<minibag::IndexEntry>,std::allocator<minibag::IndexEntry>>
                *)local_60._M_dataplus._M_p,
               (_Base_ptr)
               ((_Rb_tree<minibag::IndexEntry,minibag::IndexEntry,std::_Identity<minibag::IndexEntry>,std::less<minibag::IndexEntry>,std::allocator<minibag::IndexEntry>>
                 *)local_60._M_dataplus._M_p + 8),(IndexEntry *)local_98,(_Alloc_node *)&local_60);
    if (*(int *)this != 1) {
      local_60._M_dataplus._M_p =
           (pointer)std::
                    map<unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>_>
                    ::operator[]((map<unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>_>
                                  *)(this + 0x1b0),&__k->id);
      std::
      _Rb_tree<minibag::IndexEntry,minibag::IndexEntry,std::_Identity<minibag::IndexEntry>,std::less<minibag::IndexEntry>,std::allocator<minibag::IndexEntry>>
      ::
      _M_insert_equal_<minibag::IndexEntry_const&,std::_Rb_tree<minibag::IndexEntry,minibag::IndexEntry,std::_Identity<minibag::IndexEntry>,std::less<minibag::IndexEntry>,std::allocator<minibag::IndexEntry>>::_Alloc_node>
                ((_Rb_tree<minibag::IndexEntry,minibag::IndexEntry,std::_Identity<minibag::IndexEntry>,std::less<minibag::IndexEntry>,std::allocator<minibag::IndexEntry>>
                  *)local_60._M_dataplus._M_p,
                 (_Base_ptr)
                 ((_Rb_tree<minibag::IndexEntry,minibag::IndexEntry,std::_Identity<minibag::IndexEntry>,std::less<minibag::IndexEntry>,std::allocator<minibag::IndexEntry>>
                   *)local_60._M_dataplus._M_p + 8),(IndexEntry *)local_98,(_Alloc_node *)&local_60)
      ;
    }
    pmVar13 = std::
              map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)(this + 0xd0),&__k->id);
    *pmVar13 = *pmVar13 + 1;
    writeMessageDataRecord<minibag::MessageInstance>(this,local_9c,time,local_68);
    uVar4 = minibag::Bag::getChunkOffset();
    miniros_console_bridge::log
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/include/minibag/bag.h"
               ,0x27f,CONSOLE_BRIDGE_LOG_DEBUG,"  curr_chunk_size=%d (threshold=%d)",(ulong)uVar4,
               (ulong)*(uint *)(this + 0x88));
    if (*(uint *)(this + 0x88) < uVar4) {
      minibag::Bag::stopWritingChunk();
      minibag::Buffer::setSize((int)this + 0x250);
      *(undefined8 *)(this + 200) = 0xffffffffffffffff;
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"Tried to insert a message with time less than ros::TIME_MIN","");
  std::runtime_error::runtime_error(this_01,(string *)local_98);
  *(undefined ***)this_01 = &PTR__runtime_error_00170e78;
  __cxa_throw(this_01,&BagException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Bag::doWrite(std::string const& topic, miniros::Time const& time, T const& msg, std::shared_ptr<miniros::M_string> const& connection_header) {

    if (time < miniros::TIME_MIN)
    {
        throw BagException("Tried to insert a message with time less than ros::TIME_MIN");
    }

    // Whenever we write we increment our revision
    bag_revision_++;

    // Get ID for connection header
    ConnectionInfo* connection_info = NULL;
    uint32_t conn_id = 0;
    if (!connection_header) {
        // No connection header: we'll manufacture one, and store by topic

        std::map<std::string, uint32_t>::iterator topic_connection_ids_iter = topic_connection_ids_.find(topic);
        if (topic_connection_ids_iter == topic_connection_ids_.end()) {
            conn_id = (uint32_t)connections_.size();
            topic_connection_ids_[topic] = conn_id;
        }
        else {
            conn_id = topic_connection_ids_iter->second;
            connection_info = connections_[conn_id];
        }
    }
    else {
        // Store the connection info by the address of the connection header

        // Add the topic name to the connection header, so that when we later search by 
        // connection header, we can disambiguate connections that differ only by topic name (i.e.,
        // same callerid, same message type), #3755.  This modified connection header is only used
        // for our bookkeeping, and will not appear in the resulting .bag.
        miniros::M_string connection_header_copy(*connection_header);
        connection_header_copy["topic"] = topic;

        std::map<miniros::M_string, uint32_t>::iterator header_connection_ids_iter = header_connection_ids_.find(connection_header_copy);
        if (header_connection_ids_iter == header_connection_ids_.end()) {
            conn_id = (uint32_t)connections_.size();
            header_connection_ids_[connection_header_copy] = conn_id;
        }
        else {
            conn_id = header_connection_ids_iter->second;
            connection_info = connections_[conn_id];
        }
    }

    {
        // Seek to the end of the file (needed in case previous operation was a read)
        seek(0, std::ios::end);
        file_size_ = file_.getOffset();

        // Write the chunk header if we're starting a new chunk
        if (!chunk_open_)
            startWritingChunk(time);

        // Write connection info record, if necessary
        if (connection_info == NULL) {
            connection_info = new ConnectionInfo();
            connection_info->id       = conn_id;
            connection_info->topic    = topic;
            connection_info->datatype = std::string(miniros::message_traits::datatype(msg));
            connection_info->md5sum   = std::string(miniros::message_traits::md5sum(msg));
            connection_info->msg_def  = std::string(miniros::message_traits::definition(msg));
            if (connection_header != NULL) {
                connection_info->header = connection_header;
            }
            else {
                connection_info->header = std::make_shared<miniros::M_string>();
                (*connection_info->header)["type"]               = connection_info->datatype;
                (*connection_info->header)["md5sum"]             = connection_info->md5sum;
                (*connection_info->header)["message_definition"] = connection_info->msg_def;
            }
            connections_[conn_id] = connection_info;
            // No need to encrypt connection records in chunks
            writeConnectionRecord(connection_info, false);
            appendConnectionRecordToBuffer(outgoing_chunk_buffer_, connection_info);
        }

        // Add to topic indexes
        IndexEntry index_entry;
        index_entry.time      = time;
        index_entry.chunk_pos = curr_chunk_info_.pos;
        index_entry.offset    = getChunkOffset();

        std::multiset<IndexEntry>& chunk_connection_index = curr_chunk_connection_indexes_[connection_info->id];
        chunk_connection_index.insert(chunk_connection_index.end(), index_entry);

        if (mode_ != BagMode::Write) {
          std::multiset<IndexEntry>& connection_index = connection_indexes_[connection_info->id];
          connection_index.insert(connection_index.end(), index_entry);
        }

        // Increment the connection count
        curr_chunk_info_.connection_counts[connection_info->id]++;

        // Write the message data
        writeMessageDataRecord(conn_id, time, msg);

        // Check if we want to stop this chunk
        uint32_t chunk_size = getChunkOffset();
        MINIROS_CONSOLE_BRIDGE_logDebug(
            "  curr_chunk_size=%d (threshold=%d)", chunk_size, chunk_threshold_);
        if (chunk_size > chunk_threshold_) {
            // Empty the outgoing chunk
            stopWritingChunk();
            outgoing_chunk_buffer_.setSize(0);

            // We no longer have a valid curr_chunk_info
            curr_chunk_info_.pos = -1;
        }
    }
}